

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

string * sznet::sz_gethostname_abi_cxx11_(void)

{
  int iVar1;
  string *in_RDI;
  allocator local_12d [20];
  allocator local_119;
  char local_118 [8];
  char buf [256];
  
  iVar1 = gethostname(local_118,0x100);
  if (iVar1 == 0) {
    buf[0xf7] = '\0';
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,local_118,&local_119);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"unknownhost",local_12d);
    std::allocator<char>::~allocator((allocator<char> *)local_12d);
  }
  return in_RDI;
}

Assistant:

string sz_gethostname()
{
	char buf[256];
	if (::gethostname(buf, sizeof(buf)) == 0)
	{
		buf[sizeof(buf) - 1] = '\0';
		return buf;
	}
	else
	{
		return "unknownhost";
	}
}